

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

bool __thiscall
TPZMatrix<long>::SolveEigensystemJacobi
          (TPZMatrix<long> *this,int64_t *numiterations,REAL *tol,TPZVec<long> *Eigenvalues,
          TPZFMatrix<long> *Eigenvectors)

{
  double dVar1;
  long lVar2;
  _func_int **pp_Var3;
  bool bVar4;
  int iVar5;
  int64_t iVar6;
  undefined4 extraout_var;
  long *plVar7;
  long lVar8;
  TPZVec<long> *in_RCX;
  double *in_RDX;
  long *in_RSI;
  TPZBaseMatrix *in_RDI;
  long *in_R8;
  __type_conflict _Var9;
  __type_conflict _Var10;
  double dVar11;
  long val;
  int64_t i_9;
  long exp_1;
  int64_t i_8;
  int64_t i_7;
  REAL norm2;
  int64_t i_6;
  double difTemp;
  double dif;
  int64_t count;
  int64_t i_5;
  int64_t i_4;
  REAL norm1;
  int64_t i_3;
  int64_t i_2;
  long exp;
  long answ;
  TPZFNMatrix<9,_long> Matrix_1;
  int64_t i_1;
  int64_t eigen;
  TPZFNMatrix<3,_long> VecIni_cp;
  TPZFNMatrix<3,_long> VecIni;
  bool result;
  int64_t j;
  int64_t i;
  TPZFNMatrix<9,_long> Matrix;
  int64_t size;
  REAL tolerance;
  int64_t NumIt;
  TPZFMatrix<long> *in_stack_fffffffffffff998;
  TPZMatrix<long> *in_stack_fffffffffffff9a0;
  long *in_stack_fffffffffffff9a8;
  TPZFNMatrix<9,_long> *in_stack_fffffffffffff9b0;
  TPZFMatrix<long> *in_stack_fffffffffffff9b8;
  TPZFNMatrix<9,_long> *in_stack_fffffffffffff9c0;
  int64_t in_stack_fffffffffffff9c8;
  TPZFNMatrix<3,_long> *in_stack_fffffffffffff9d0;
  TPZMatrix<long> *in_stack_fffffffffffff9e8;
  TPZFMatrix<long> *in_stack_fffffffffffff9f0;
  TPZVec<long> *in_stack_fffffffffffff9f8;
  long *in_stack_fffffffffffffa00;
  _func_int **local_4e0;
  long local_4d8;
  long local_4c8;
  TPZVec<long> *in_stack_fffffffffffffb40;
  REAL *in_stack_fffffffffffffb48;
  int64_t *in_stack_fffffffffffffb50;
  long lVar12;
  TPZMatrix<long> *in_stack_fffffffffffffb58;
  double __x;
  double local_4a0;
  long local_498;
  long local_490;
  long local_488;
  double local_480;
  long local_470;
  long local_460;
  long local_2d0;
  long local_2c8;
  long local_138;
  long local_130;
  bool local_1;
  
  lVar2 = *in_RSI;
  dVar1 = *in_RDX;
  iVar6 = TPZBaseMatrix::Rows(in_RDI);
  TPZFNMatrix<9,_long>::TPZFNMatrix
            (in_stack_fffffffffffff9b0,(int64_t)in_stack_fffffffffffff9a8,
             (int64_t)in_stack_fffffffffffff9a0);
  for (local_130 = 0; local_130 < iVar6; local_130 = local_130 + 1) {
    for (local_138 = 0; local_138 < iVar6; local_138 = local_138 + 1) {
      iVar5 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x21])(in_RDI,local_130,local_138);
      plVar7 = TPZFMatrix<long>::operator()
                         (&in_stack_fffffffffffff9b0->super_TPZFMatrix<long>,
                          (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
      *plVar7 = CONCAT44(extraout_var,iVar5);
    }
  }
  bVar4 = SolveEigenvaluesJacobi
                    (in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                     in_stack_fffffffffffffb40);
  if (bVar4) {
    TPZFNMatrix<3,_long>::TPZFNMatrix
              (in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,
               (int64_t)in_stack_fffffffffffff9c0,(long *)in_stack_fffffffffffff9b8);
    TPZFNMatrix<3,_long>::TPZFNMatrix
              (in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8,
               (int64_t)in_stack_fffffffffffff9c0,(long *)in_stack_fffffffffffff9b8);
    (**(code **)(*in_R8 + 0x68))(in_R8,iVar6);
    (**(code **)(*in_R8 + 0x78))();
    for (local_2c8 = 0; local_2c8 < iVar6; local_2c8 = local_2c8 + 1) {
      for (local_2d0 = 0; local_2d0 < iVar6; local_2d0 = local_2d0 + 1) {
        rand();
        TPZFMatrix<long>::PutVal
                  (&in_stack_fffffffffffff9b0->super_TPZFMatrix<long>,
                   (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0,
                   (long *)in_stack_fffffffffffff998);
      }
      TPZFMatrix<long>::TPZFMatrix(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
      TPZFNMatrix<9,_long>::TPZFNMatrix(in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8);
      TPZFMatrix<long>::~TPZFMatrix((TPZFMatrix<long> *)0x12e914d);
      TPZVec<long>::operator[](in_RCX,local_2c8);
      lVar8 = ReturnNearestValue((long)in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,
                                 (long)in_stack_fffffffffffff9f0);
      plVar7 = TPZVec<long>::operator[](in_RCX,local_2c8);
      lVar12 = *plVar7;
      _Var9 = std::fabs<long>(lVar8 - lVar12);
      if (_Var9 <= 1e-05) {
        for (local_470 = 0; local_470 < iVar6; local_470 = local_470 + 1) {
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_470);
          TPZVec<long>::operator[](in_RCX,local_2c8);
          TPZFMatrix<long>::PutVal
                    (&in_stack_fffffffffffff9b0->super_TPZFMatrix<long>,
                     (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0,
                     (long *)in_stack_fffffffffffff998);
        }
      }
      else {
        for (local_460 = 0; local_460 < iVar6; local_460 = local_460 + 1) {
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_460);
          TPZVec<long>::operator[](in_RCX,local_2c8);
          std::fabs<long>(lVar8 - lVar12);
          TPZFMatrix<long>::PutVal
                    (&in_stack_fffffffffffff9b0->super_TPZFMatrix<long>,
                     (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0,
                     (long *)in_stack_fffffffffffff998);
        }
      }
      local_480 = 0.0;
      for (local_488 = 0; local_488 < iVar6; local_488 = local_488 + 1) {
        plVar7 = TPZFMatrix<long>::operator()
                           (&in_stack_fffffffffffff9b0->super_TPZFMatrix<long>,
                            (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
        _Var9 = std::fabs<long>(*plVar7);
        plVar7 = TPZFMatrix<long>::operator()
                           (&in_stack_fffffffffffff9b0->super_TPZFMatrix<long>,
                            (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
        _Var10 = std::fabs<long>(*plVar7);
        local_480 = _Var9 * _Var10 + local_480;
      }
      dVar11 = sqrt(local_480);
      for (local_490 = 0; local_490 < iVar6; local_490 = local_490 + 1) {
        plVar7 = TPZFMatrix<long>::operator()
                           (&in_stack_fffffffffffff9b0->super_TPZFMatrix<long>,
                            (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
        lVar12 = *plVar7;
        plVar7 = TPZFMatrix<long>::operator()
                           (&in_stack_fffffffffffff9b0->super_TPZFMatrix<long>,
                            (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
        *plVar7 = lVar12 / (long)dVar11;
      }
      local_4a0 = 10.0;
      for (local_498 = 0; dVar1 < local_4a0 && local_498 <= lVar2; local_498 = local_498 + 1) {
        for (lVar12 = 0; lVar12 < iVar6; lVar12 = lVar12 + 1) {
          plVar7 = TPZFMatrix<long>::operator()
                             (&in_stack_fffffffffffff9b0->super_TPZFMatrix<long>,
                              (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0)
          ;
          lVar8 = *plVar7;
          plVar7 = TPZFMatrix<long>::operator()
                             (&in_stack_fffffffffffff9b0->super_TPZFMatrix<long>,
                              (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0)
          ;
          *plVar7 = lVar8;
        }
        Solve_LU(in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
        dVar11 = 0.0;
        for (lVar12 = 0; lVar12 < iVar6; lVar12 = lVar12 + 1) {
          plVar7 = TPZFMatrix<long>::operator()
                             (&in_stack_fffffffffffff9b0->super_TPZFMatrix<long>,
                              (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0)
          ;
          _Var9 = std::fabs<long>(*plVar7);
          plVar7 = TPZFMatrix<long>::operator()
                             (&in_stack_fffffffffffff9b0->super_TPZFMatrix<long>,
                              (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0)
          ;
          _Var10 = std::fabs<long>(*plVar7);
          dVar11 = _Var9 * _Var10 + dVar11;
        }
        dVar11 = sqrt(dVar11);
        __x = 0.0;
        for (local_4c8 = 0; local_4c8 < iVar6; local_4c8 = local_4c8 + 1) {
          in_stack_fffffffffffffa00 =
               TPZFMatrix<long>::operator()
                         (&in_stack_fffffffffffff9b0->super_TPZFMatrix<long>,
                          (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
          in_stack_fffffffffffff9f0 =
               (TPZFMatrix<long> *)(*in_stack_fffffffffffffa00 / (long)dVar11);
          in_stack_fffffffffffff9f8 =
               (TPZVec<long> *)
               TPZFMatrix<long>::operator()
                         (&in_stack_fffffffffffff9b0->super_TPZFMatrix<long>,
                          (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
          in_stack_fffffffffffff9f8->_vptr_TPZVec = (_func_int **)in_stack_fffffffffffff9f0;
          in_stack_fffffffffffff9e8 =
               (TPZMatrix<long> *)
               TPZFMatrix<long>::operator()
                         (&in_stack_fffffffffffff9b0->super_TPZFMatrix<long>,
                          (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
          pp_Var3 = (in_stack_fffffffffffff9e8->super_TPZBaseMatrix).super_TPZSavable.
                    _vptr_TPZSavable;
          plVar7 = TPZFMatrix<long>::operator()
                             (&in_stack_fffffffffffff9b0->super_TPZFMatrix<long>,
                              (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0)
          ;
          lVar12 = (long)pp_Var3 - *plVar7;
          plVar7 = TPZFMatrix<long>::operator()
                             (&in_stack_fffffffffffff9b0->super_TPZFMatrix<long>,
                              (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0)
          ;
          in_stack_fffffffffffff9b8 = (TPZFMatrix<long> *)*plVar7;
          in_stack_fffffffffffff9c0 =
               (TPZFNMatrix<9,_long> *)
               TPZFMatrix<long>::operator()
                         (&in_stack_fffffffffffff9b0->super_TPZFMatrix<long>,
                          (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
          in_stack_fffffffffffff9b0 =
               (TPZFNMatrix<9,_long> *)
               std::fabs<long>(lVar12 * ((long)in_stack_fffffffffffff9b8 -
                                        (long)(in_stack_fffffffffffff9c0->super_TPZFMatrix<long>).
                                              super_TPZMatrix<long>.super_TPZBaseMatrix.
                                              super_TPZSavable._vptr_TPZSavable));
          __x = (double)in_stack_fffffffffffff9b0 + __x;
        }
        local_4a0 = sqrt(__x);
      }
      for (local_4d8 = 0; local_4d8 < iVar6; local_4d8 = local_4d8 + 1) {
        in_stack_fffffffffffff9a8 =
             TPZFMatrix<long>::operator()
                       (&in_stack_fffffffffffff9b0->super_TPZFMatrix<long>,
                        (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
        local_4e0 = (_func_int **)*in_stack_fffffffffffff9a8;
        in_stack_fffffffffffff9a0 = (TPZMatrix<long> *)std::fabs<long>((long)local_4e0);
        if ((double)in_stack_fffffffffffff9a0 < 1e-05) {
          local_4e0 = (_func_int **)0x0;
        }
        in_stack_fffffffffffff998 =
             (TPZFMatrix<long> *)
             TPZFMatrix<long>::operator()
                       (&in_stack_fffffffffffff9b0->super_TPZFMatrix<long>,
                        (int64_t)in_stack_fffffffffffff9a8,(int64_t)in_stack_fffffffffffff9a0);
        (in_stack_fffffffffffff998->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable = local_4e0;
      }
      TPZFNMatrix<9,_long>::~TPZFNMatrix((TPZFNMatrix<9,_long> *)0x12e9b2c);
    }
    local_1 = true;
    TPZFNMatrix<3,_long>::~TPZFNMatrix((TPZFNMatrix<3,_long> *)0x12e9b65);
    TPZFNMatrix<3,_long>::~TPZFNMatrix((TPZFNMatrix<3,_long> *)0x12e9b72);
  }
  else {
    local_1 = false;
  }
  TPZFNMatrix<9,_long>::~TPZFNMatrix((TPZFNMatrix<9,_long> *)0x12e9b9d);
  return local_1;
}

Assistant:

bool TPZMatrix<TVar>::SolveEigensystemJacobi(int64_t &numiterations, REAL & tol, TPZVec<TVar> & Eigenvalues, TPZFMatrix<TVar> & Eigenvectors) const{
	
	int64_t NumIt = numiterations;
	REAL tolerance = tol;
	
#ifdef PZDEBUG2
	if (this->Rows() != this->Cols())
	{
		PZError << __PRETTY_FUNCTION__ <<
		" - Jacobi method of computing eigensystem requires a symmetric square matrix. this->Rows = " << this->Rows() << " - this->Cols() = " << this->Cols() << endl;
		return false;
	}
	
	if (this->VerifySymmetry(1.e-8) == false)
	{
		PZError << __PRETTY_FUNCTION__ <<
		" - Jacobi method of computing eigensystem requires a symmetric square matrix. This matrix is not symmetric." << endl;
		return false;
	}
#endif
	
	const int64_t size = this->Rows();
	
	/** Making a copy of this */
	TPZFNMatrix<9,TVar> Matrix(size,size); //fast constructor in case of this is a stress or strain tensor.
	for(int64_t i = 0; i < size; i++) for(int64_t j = 0; j < size; j++) Matrix(i,j) = this->Get(i,j);
	
	/** Compute Eigenvalues *//////////////////////////////////////
	bool result = Matrix.SolveEigenvaluesJacobi(numiterations, tol, &Eigenvalues);
	if (result == false) return false;
	
	/** Compute Eigenvectors *//////////////////////////////////////
	TPZFNMatrix<3, TVar> VecIni(size,1,0.), VecIni_cp(size,1,0.);
	
	Eigenvectors.Resize(size, size);
	Eigenvectors.Zero();
	for(int64_t eigen = 0; eigen < size; eigen++)
	{
        for(int64_t i = 0; i < size; i++) VecIni.PutVal(i,0,rand());
		
        TPZFNMatrix<9,TVar> Matrix(*this);
		
        TVar answ = ReturnNearestValue(Eigenvalues[eigen], Eigenvalues,((TVar)1.E-5));
        TVar exp = answ - Eigenvalues[eigen];
        if((REAL)(fabs(exp)) > 1.E-5)
        {
            for(int64_t i = 0; i < size; i++) Matrix.PutVal(i,i, this->GetVal(i,i) - (TVar)(Eigenvalues[eigen] - (TVar)(0.01 * fabs(exp))) );
        }
        else
        {
            for(int64_t i = 0; i < size; i++) Matrix.PutVal(i,i, this->GetVal(i,i) - (Eigenvalues[eigen] - TVar(0.01)) );
        }
		
        /** Normalizing Initial Eigenvec */
        REAL norm1 = 0.;
        for(int64_t i = 0; i < size; i++) norm1 += fabs(VecIni(i,0)) * fabs(VecIni(i,0)); norm1 = sqrt(norm1);
        for(int64_t i = 0; i < size; i++) VecIni(i,0) = VecIni(i,0)/(TVar)norm1;
		
        int64_t count = 0;
        double dif = 10., difTemp = 0.;
		
        while(dif > tolerance && count <= NumIt)
        {
			for(int64_t i = 0; i < size; i++) VecIni_cp(i,0) = VecIni(i,0);
			
			/** Estimating Eigenvec */
			Matrix.Solve_LU(&VecIni);
			
			/** Normalizing Final Eigenvec */
			REAL norm2 = 0.;
			for(int64_t i = 0; i < size; i++) norm2 += fabs(VecIni(i,0)) * fabs(VecIni(i,0));
			norm2 = sqrt(norm2);
			
			difTemp = 0.;
			for(int64_t i = 0; i < size; i++)
			{
                VecIni(i,0) = VecIni(i,0)/(TVar)norm2;
                TVar exp = (VecIni_cp(i,0) - VecIni(i,0)) * (VecIni_cp(i,0) - VecIni(i,0));
                difTemp += fabs(exp);
			}
			dif = sqrt(difTemp);
			count++;
        }
		
        /** Copy values from AuxVector to Eigenvectors */
        for(int64_t i = 0; i < size; i++)
        {
			TVar val = VecIni(i,0);
			if((REAL)(fabs(val)) < 1.E-5) val = 0.;
			Eigenvectors(eigen,i) = val;
        }
		
#ifdef PZDEBUG2
        double norm = 0.;
        for(int64_t i = 0; i < size; i++) norm += fabs(VecIni(i,0)) * fabs(VecIni(i,0));
        if (fabs(norm - 1.) > 1.e-10)
        {
            PZError << __PRETTY_FUNCTION__ << endl;
        }
        if(count > NumIt-1)// O metodo nao convergiu !!!
        {
            PZError << __PRETTY_FUNCTION__ << endl;
#ifdef PZ_LOG
            {
                std::stringstream sout;
                Print("Matrix for SolveEigensystemJacobi did not converge",sout);
                LOGPZ_DEBUG(logger,sout.str());
            }
#endif
        }
#endif
	}
	
	return true;
	
}